

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetCacheSize(Btree *p,int mxPage)

{
  undefined4 in_ESI;
  long in_RDI;
  BtShared *pBt;
  int mxPage_00;
  undefined4 in_stack_fffffffffffffff0;
  
  mxPage_00 = (int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  sqlite3BtreeEnter((Btree *)0x15aad4);
  sqlite3PagerSetCachesize((Pager *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),mxPage_00);
  sqlite3BtreeLeave((Btree *)0x15aaee);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetCacheSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetCachesize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}